

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O3

int __thiscall
ncnn::Dequantize::forward(Dequantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  
  iVar3 = bottom_blob->dims;
  if (iVar3 == 3) {
    iVar3 = bottom_blob->w;
    iVar5 = bottom_blob->h;
    uVar4 = bottom_blob->c;
    Mat::create(top_blob,iVar3,iVar5,uVar4,4,opt->blob_allocator);
    pvVar15 = top_blob->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    sVar8 = top_blob->cstep;
    if ((long)top_blob->c * sVar8 == 0) {
      return -100;
    }
    uVar16 = iVar5 * iVar3;
    iVar3 = this->bias_data_size;
    if (iVar3 == 0) {
      if ((int)uVar4 < 1) {
        return 0;
      }
      pvVar14 = bottom_blob->data;
      sVar9 = bottom_blob->cstep;
      iVar3 = this->scale_data_size;
      sVar10 = top_blob->elemsize;
      sVar11 = bottom_blob->elemsize;
      uVar18 = 0;
      do {
        uVar17 = 0;
        if (iVar3 != 1) {
          uVar17 = uVar18 & 0xffffffff;
        }
        if (0 < (int)uVar16) {
          fVar1 = *(float *)((long)(this->scale_data).data + uVar17 * 4);
          uVar17 = 0;
          do {
            *(float *)((long)pvVar15 + uVar17 * 4) =
                 (float)*(int *)((long)pvVar14 + uVar17 * 4) * fVar1;
            uVar17 = uVar17 + 1;
          } while (uVar16 != uVar17);
        }
        uVar18 = uVar18 + 1;
        pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
        pvVar14 = (void *)((long)pvVar14 + sVar9 * sVar11);
      } while (uVar18 != uVar4);
      return 0;
    }
    if ((int)uVar4 < 1) {
      return 0;
    }
    pvVar14 = bottom_blob->data;
    sVar9 = bottom_blob->cstep;
    iVar5 = this->scale_data_size;
    sVar10 = top_blob->elemsize;
    sVar11 = bottom_blob->elemsize;
    uVar18 = 0;
    do {
      uVar17 = uVar18 & 0xffffffff;
      if (iVar5 == 1) {
        uVar17 = 0;
      }
      uVar19 = uVar18 & 0xffffffff;
      if (iVar3 == 1) {
        uVar19 = 0;
      }
      if (0 < (int)uVar16) {
        fVar1 = *(float *)((long)(this->scale_data).data + uVar17 * 4);
        fVar2 = *(float *)((long)(this->bias_data).data + uVar19 * 4);
        uVar17 = 0;
        do {
          *(float *)((long)pvVar15 + uVar17 * 4) =
               (float)*(int *)((long)pvVar14 + uVar17 * 4) * fVar1 + fVar2;
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
      uVar18 = uVar18 + 1;
      pvVar15 = (void *)((long)pvVar15 + sVar8 * sVar10);
      pvVar14 = (void *)((long)pvVar14 + sVar9 * sVar11);
    } while (uVar18 != uVar4);
  }
  else {
    if (iVar3 != 2) {
      if (iVar3 != 1) {
        return 0;
      }
      uVar4 = bottom_blob->w;
      uVar18 = (ulong)uVar4;
      Mat::create(top_blob,uVar4,4,opt->blob_allocator);
      pvVar15 = top_blob->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      pvVar14 = bottom_blob->data;
      if (this->scale_data_size == 1) {
        fVar1 = *(this->scale_data).data;
        if (this->bias_data_size == 1) {
          if ((int)uVar4 < 1) {
            return 0;
          }
          fVar2 = *(this->bias_data).data;
          uVar17 = 0;
          do {
            *(float *)((long)pvVar15 + uVar17 * 4) =
                 (float)*(int *)((long)pvVar14 + uVar17 * 4) * fVar1 + fVar2;
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
          return 0;
        }
        if (this->bias_data_size == 0) {
          if ((int)uVar4 < 1) {
            return 0;
          }
          uVar17 = 0;
          do {
            *(float *)((long)pvVar15 + uVar17 * 4) =
                 (float)*(int *)((long)pvVar14 + uVar17 * 4) * fVar1;
            uVar17 = uVar17 + 1;
          } while (uVar18 != uVar17);
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar12 = (this->bias_data).data;
        uVar17 = 0;
        do {
          *(float *)((long)pvVar15 + uVar17 * 4) =
               (float)*(int *)((long)pvVar14 + uVar17 * 4) * fVar1 +
               *(float *)((long)pvVar12 + uVar17 * 4);
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
        return 0;
      }
      if (this->bias_data_size == 1) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        fVar1 = *(this->bias_data).data;
        pvVar12 = (this->scale_data).data;
        uVar17 = 0;
        do {
          *(float *)((long)pvVar15 + uVar17 * 4) =
               (float)*(int *)((long)pvVar14 + uVar17 * 4) * *(float *)((long)pvVar12 + uVar17 * 4)
               + fVar1;
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
        return 0;
      }
      if (this->bias_data_size == 0) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar12 = (this->scale_data).data;
        uVar17 = 0;
        do {
          *(float *)((long)pvVar15 + uVar17 * 4) =
               (float)*(int *)((long)pvVar14 + uVar17 * 4) * *(float *)((long)pvVar12 + uVar17 * 4);
          uVar17 = uVar17 + 1;
        } while (uVar18 != uVar17);
        return 0;
      }
      if ((int)uVar4 < 1) {
        return 0;
      }
      pvVar12 = (this->scale_data).data;
      pvVar13 = (this->bias_data).data;
      uVar17 = 0;
      do {
        *(float *)((long)pvVar15 + uVar17 * 4) =
             (float)*(int *)((long)pvVar14 + uVar17 * 4) * *(float *)((long)pvVar12 + uVar17 * 4) +
             *(float *)((long)pvVar13 + uVar17 * 4);
        uVar17 = uVar17 + 1;
      } while (uVar18 != uVar17);
      return 0;
    }
    uVar4 = bottom_blob->w;
    uVar16 = bottom_blob->h;
    Mat::create(top_blob,uVar4,uVar16,4,opt->blob_allocator);
    pvVar15 = top_blob->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    iVar3 = this->bias_data_size;
    if (iVar3 == 0) {
      if ((int)uVar16 < 1) {
        return 0;
      }
      pvVar14 = bottom_blob->data;
      iVar3 = bottom_blob->w;
      iVar5 = top_blob->w;
      sVar8 = top_blob->elemsize;
      iVar6 = this->scale_data_size;
      sVar9 = bottom_blob->elemsize;
      uVar18 = 0;
      do {
        uVar17 = 0;
        if (iVar6 != 1) {
          uVar17 = uVar18 & 0xffffffff;
        }
        if (0 < (int)uVar4) {
          fVar1 = *(float *)((long)(this->scale_data).data + uVar17 * 4);
          uVar17 = 0;
          do {
            *(float *)((long)pvVar15 + uVar17 * 4) =
                 (float)*(int *)((long)pvVar14 + uVar17 * 4) * fVar1;
            uVar17 = uVar17 + 1;
          } while (uVar4 != uVar17);
        }
        uVar18 = uVar18 + 1;
        pvVar15 = (void *)((long)pvVar15 + (long)iVar5 * sVar8);
        pvVar14 = (void *)((long)pvVar14 + (long)iVar3 * sVar9);
      } while (uVar18 != uVar16);
      return 0;
    }
    if ((int)uVar16 < 1) {
      return 0;
    }
    pvVar14 = bottom_blob->data;
    iVar5 = bottom_blob->w;
    iVar6 = top_blob->w;
    iVar7 = this->scale_data_size;
    sVar8 = top_blob->elemsize;
    sVar9 = bottom_blob->elemsize;
    uVar18 = 0;
    do {
      uVar17 = uVar18 & 0xffffffff;
      if (iVar7 == 1) {
        uVar17 = 0;
      }
      uVar19 = uVar18 & 0xffffffff;
      if (iVar3 == 1) {
        uVar19 = 0;
      }
      if (0 < (int)uVar4) {
        fVar1 = *(float *)((long)(this->scale_data).data + uVar17 * 4);
        fVar2 = *(float *)((long)(this->bias_data).data + uVar19 * 4);
        uVar17 = 0;
        do {
          *(float *)((long)pvVar15 + uVar17 * 4) =
               (float)*(int *)((long)pvVar14 + uVar17 * 4) * fVar1 + fVar2;
          uVar17 = uVar17 + 1;
        } while (uVar4 != uVar17);
      }
      uVar18 = uVar18 + 1;
      pvVar15 = (void *)((long)pvVar15 + (long)iVar6 * sVar8);
      pvVar14 = (void *)((long)pvVar14 + (long)iVar5 * sVar9);
    } while (uVar18 != uVar16);
  }
  return 0;
}

Assistant:

int Dequantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int* intptr = bottom_blob;
        float* ptr = top_blob;

        if (scale_data_size == 1)
        {
            const float scale = scale_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias_data[i];
                }
            }
        }
        else
        {
            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i];
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias_data[i];
                }
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale + bias;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
    }

    return 0;
}